

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_utils.cpp
# Opt level: O2

void spvtools::opt::anon_unknown_15::MakeSetClosedSSA
               (IRContext *context,Function *function,
               unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
               *blocks,unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
                       *exit_bb,LCSSARewriter *lcssa_rewriter)

{
  Instruction *def;
  bool bVar1;
  CFG *this;
  DominatorTree *this_00;
  DefUseManager *this_01;
  __node_base *p_Var2;
  BasicBlock *A;
  DefUseManager *this_02;
  __node_base *p_Var3;
  Instruction *inst;
  __node_base *p_Var4;
  _Any_data local_d0;
  code *local_c0;
  code *local_b8;
  UseRewriter rewriter;
  
  this = IRContext::cfg(context);
  this_00 = (DominatorTree *)IRContext::GetDominatorAnalysis(context,function);
  this_01 = IRContext::get_def_use_mgr(context);
  p_Var2 = &(blocks->_M_h)._M_before_begin;
LAB_0021764c:
  do {
    p_Var2 = p_Var2->_M_nxt;
    if (p_Var2 == (__node_base *)0x0) {
      return;
    }
    A = CFG::block(this,(uint32_t)*(size_type *)(p_Var2 + 1));
    p_Var4 = &(exit_bb->_M_h)._M_before_begin;
    do {
      p_Var4 = p_Var4->_M_nxt;
      if (p_Var4 == (__node_base *)0x0) goto LAB_0021764c;
      bVar1 = DominatorTree::Dominates(this_00,A,(BasicBlock *)p_Var4[1]._M_nxt);
    } while (!bVar1);
    def = &(A->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
    while (def = *(Instruction **)
                  ((long)&def->super_IntrusiveNodeBase<spvtools::opt::Instruction> + 8),
          def != &(A->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_) {
      rewriter.bb_to_phi_._M_h._M_buckets = &rewriter.bb_to_phi_._M_h._M_single_bucket;
      rewriter.bb_to_phi_._M_h._M_bucket_count = 1;
      rewriter.bb_to_phi_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      rewriter.bb_to_phi_._M_h._M_element_count = 0;
      rewriter.bb_to_phi_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
      rewriter.bb_to_phi_._M_h._M_rehash_policy._M_next_resize = 0;
      rewriter.bb_to_phi_._M_h._M_single_bucket = (__node_base_ptr)0x0;
      rewriter.rewritten_._M_h._M_buckets = &rewriter.rewritten_._M_h._M_single_bucket;
      rewriter.rewritten_._M_h._M_bucket_count = 1;
      rewriter.rewritten_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      rewriter.rewritten_._M_h._M_element_count = 0;
      rewriter.rewritten_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
      rewriter.rewritten_._M_h._M_rehash_policy._M_next_resize = 0;
      rewriter.rewritten_._M_h._M_single_bucket = (__node_base_ptr)0x0;
      local_d0._8_8_ = 0;
      rewriter.base_ = lcssa_rewriter;
      rewriter.def_insn_ = def;
      local_d0._M_unused._M_object = operator_new(0x20);
      *(unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
        **)local_d0._M_unused._0_8_ = blocks;
      *(UseRewriter **)((long)local_d0._M_unused._0_8_ + 8) = &rewriter;
      *(unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
        **)((long)local_d0._M_unused._0_8_ + 0x10) = exit_bb;
      *(IRContext **)((long)local_d0._M_unused._0_8_ + 0x18) = context;
      local_b8 = std::
                 _Function_handler<void_(spvtools::opt::Instruction_*,_unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_utils.cpp:289:18)>
                 ::_M_invoke;
      local_c0 = std::
                 _Function_handler<void_(spvtools::opt::Instruction_*,_unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_utils.cpp:289:18)>
                 ::_M_manager;
      analysis::DefUseManager::ForEachUse
                (this_01,def,
                 (function<void_(spvtools::opt::Instruction_*,_unsigned_int)> *)&local_d0);
      if (local_c0 != (code *)0x0) {
        (*local_c0)(&local_d0,&local_d0,__destroy_functor);
      }
      this_02 = IRContext::get_def_use_mgr((rewriter.base_)->context_);
      p_Var3 = &rewriter.rewritten_._M_h._M_before_begin;
      while (p_Var3 = p_Var3->_M_nxt, p_Var3 != (__node_base *)0x0) {
        analysis::DefUseManager::AnalyzeInstDef(this_02,(Instruction *)p_Var3[1]._M_nxt);
      }
      p_Var3 = &rewriter.rewritten_._M_h._M_before_begin;
      while (p_Var3 = p_Var3->_M_nxt, p_Var3 != (__node_base *)0x0) {
        analysis::DefUseManager::AnalyzeInstUse(this_02,(Instruction *)p_Var3[1]._M_nxt);
      }
      std::
      _Hashtable<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable(&rewriter.rewritten_._M_h);
      std::
      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&rewriter.bb_to_phi_._M_h);
    }
  } while( true );
}

Assistant:

inline void MakeSetClosedSSA(IRContext* context, Function* function,
                             const std::unordered_set<uint32_t>& blocks,
                             const std::unordered_set<BasicBlock*>& exit_bb,
                             LCSSARewriter* lcssa_rewriter) {
  CFG& cfg = *context->cfg();
  DominatorTree& dom_tree =
      context->GetDominatorAnalysis(function)->GetDomTree();
  analysis::DefUseManager* def_use_manager = context->get_def_use_mgr();

  for (uint32_t bb_id : blocks) {
    BasicBlock* bb = cfg.block(bb_id);
    // If bb does not dominate an exit block, then it cannot have escaping defs.
    if (!DominatesAnExit(bb, exit_bb, dom_tree)) continue;
    for (Instruction& inst : *bb) {
      LCSSARewriter::UseRewriter rewriter(lcssa_rewriter, inst);
      def_use_manager->ForEachUse(
          &inst, [&blocks, &rewriter, &exit_bb, context](
                     Instruction* use, uint32_t operand_index) {
            BasicBlock* use_parent = context->get_instr_block(use);
            assert(use_parent);
            if (blocks.count(use_parent->id())) return;

            if (use->opcode() == spv::Op::OpPhi) {
              // If the use is a Phi instruction and the incoming block is
              // coming from the loop, then that's consistent with LCSSA form.
              if (exit_bb.count(use_parent)) {
                return;
              } else {
                // That's not an exit block, but the user is a phi instruction.
                // Consider the incoming branch only.
                use_parent = context->get_instr_block(
                    use->GetSingleWordOperand(operand_index + 1));
              }
            }
            // Rewrite the use. Note that this call does not invalidate the
            // def/use manager. So this operation is safe.
            rewriter.RewriteUse(use_parent, use, operand_index);
          });
      rewriter.UpdateManagers();
    }
  }
}